

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

Status __thiscall leveldb::DBImpl::TEST_CompactMemTable(DBImpl *this)

{
  bool bVar1;
  Status *in_RSI;
  Status *in_RDI;
  long in_FS_OFFSET;
  Status *s;
  MutexLock l;
  MutexLock *in_stack_ffffffffffffff88;
  undefined6 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9e;
  Status *rhs;
  undefined1 local_9;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_9 = 0;
  rhs = in_RDI;
  WriteOptions::WriteOptions((WriteOptions *)in_stack_ffffffffffffff88);
  (**(code **)(in_RSI->state_ + 0x20))(in_RDI,in_RSI,&local_9,0);
  bVar1 = Status::ok((Status *)in_stack_ffffffffffffff88);
  if (bVar1) {
    MutexLock::MutexLock(in_stack_ffffffffffffff88,(Mutex *)0x188d33d);
    while( true ) {
      bVar1 = false;
      if (in_RSI[0x27].state_ != (char *)0x0) {
        in_stack_ffffffffffffff9e = Status::ok((Status *)in_stack_ffffffffffffff88);
        bVar1 = (bool)in_stack_ffffffffffffff9e;
      }
      if (bVar1 == false) break;
      port::CondVar::Wait((CondVar *)
                          CONCAT17(bVar1,CONCAT16(in_stack_ffffffffffffff9e,
                                                  in_stack_ffffffffffffff98)));
    }
    if (in_RSI[0x27].state_ != (char *)0x0) {
      Status::operator=(in_RSI,rhs);
    }
    MutexLock::~MutexLock(in_stack_ffffffffffffff88);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (Status)(char *)rhs;
  }
  __stack_chk_fail();
}

Assistant:

Status DBImpl::TEST_CompactMemTable() {
  // nullptr batch means just wait for earlier writes to be done
  Status s = Write(WriteOptions(), nullptr);
  if (s.ok()) {
    // Wait until the compaction completes
    MutexLock l(&mutex_);
    while (imm_ != nullptr && bg_error_.ok()) {
      background_work_finished_signal_.Wait();
    }
    if (imm_ != nullptr) {
      s = bg_error_;
    }
  }
  return s;
}